

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

opj_tcd_v2_t * tcd_create_v2(opj_bool p_is_decoder)

{
  opj_tcd_v2_t *__ptr;
  opj_tcd_image_v2_t *poVar1;
  
  __ptr = (opj_tcd_v2_t *)calloc(1,0x40);
  if (__ptr != (opj_tcd_v2_t *)0x0) {
    __ptr->field_0x3c = p_is_decoder != 0;
    poVar1 = (opj_tcd_image_v2_t *)malloc(8);
    __ptr->tcd_image = poVar1;
    if (poVar1 != (opj_tcd_image_v2_t *)0x0) {
      poVar1->tiles = (opj_tcd_tile_v2_t *)0x0;
      return __ptr;
    }
    free(__ptr);
  }
  return (opj_tcd_v2_t *)0x0;
}

Assistant:

opj_tcd_v2_t* tcd_create_v2(opj_bool p_is_decoder)
{
	opj_tcd_v2_t *l_tcd = 00;

	/* create the tcd structure */
	l_tcd = (opj_tcd_v2_t*)	opj_malloc(sizeof(opj_tcd_v2_t));
	if (!l_tcd) {
		return 00;
	}
	memset(l_tcd,0,sizeof(opj_tcd_v2_t));

	l_tcd->m_is_decoder = p_is_decoder ? 1 : 0;

	l_tcd->tcd_image = (opj_tcd_image_v2_t*)opj_malloc(sizeof(opj_tcd_image_v2_t));
	if (!l_tcd->tcd_image) {
		opj_free(l_tcd);
		return 00;
	}
	memset(l_tcd->tcd_image,0,sizeof(opj_tcd_image_v2_t));

	return l_tcd;
}